

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodeevents.cpp
# Opt level: O1

void __thiscall YAML::NodeEvents::Setup(NodeEvents *this,node *node)

{
  int iVar1;
  element_type *peVar2;
  element_type *peVar3;
  node *node_00;
  mapped_type_conflict *pmVar4;
  value vVar5;
  element_type **ppeVar6;
  MapIter *pMVar7;
  const_node_iterator __begin2;
  const_node_iterator __end2;
  const_node_iterator local_70;
  const_node_iterator local_50;
  
  local_70._0_8_ =
       (node->m_pRef).super___shared_ptr<YAML::detail::node_ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pmVar4 = std::
           map<const_YAML::detail::node_ref_*,_int,_std::less<const_YAML::detail::node_ref_*>,_std::allocator<std::pair<const_YAML::detail::node_ref_*const,_int>_>_>
           ::operator[](&this->m_refCount,(key_type *)&local_70);
  iVar1 = *pmVar4;
  *pmVar4 = iVar1 + 1;
  if (iVar1 < 1) {
    peVar2 = (node->m_pRef).super___shared_ptr<YAML::detail::node_ref,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    peVar3 = (peVar2->m_pData).
             super___shared_ptr<YAML::detail::node_data,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    vVar5 = Undefined;
    if (peVar3->m_isDefined != false) {
      vVar5 = peVar3->m_type;
    }
    if (vVar5 == Map) {
      detail::node_data::begin
                (&local_70,
                 (peVar2->m_pData).
                 super___shared_ptr<YAML::detail::node_data,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      detail::node_data::end
                (&local_50,
                 (((node->m_pRef).
                   super___shared_ptr<YAML::detail::node_ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 m_pData).super___shared_ptr<YAML::detail::node_data,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr);
      do {
        if (local_70.m_type == local_50.m_type) {
          ppeVar6 = (element_type **)&local_70.m_seqIt;
          pMVar7 = (MapIter *)&local_50.m_seqIt;
          if (local_70.m_type != Sequence) {
            if (local_70.m_type != Map) {
              return;
            }
            ppeVar6 = (element_type **)&local_70.m_mapIt;
            pMVar7 = &local_50.m_mapIt;
          }
          if ((pair<YAML::detail::node_*,_YAML::detail::node_*> *)*ppeVar6 == pMVar7->_M_current) {
            return;
          }
        }
        node_00 = (local_70.m_mapIt._M_current)->second;
        Setup(this,(local_70.m_mapIt._M_current)->first);
        Setup(this,node_00);
        detail::node_iterator_base<const_YAML::detail::node>::operator++(&local_70);
      } while( true );
    }
    if (vVar5 == Sequence) {
      detail::node_data::begin
                (&local_70,
                 (peVar2->m_pData).
                 super___shared_ptr<YAML::detail::node_data,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      detail::node_data::end
                (&local_50,
                 (((node->m_pRef).
                   super___shared_ptr<YAML::detail::node_ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 m_pData).super___shared_ptr<YAML::detail::node_data,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr);
      while ((local_70.m_type != local_50.m_type ||
             (((ppeVar6 = (element_type **)&local_70.m_seqIt, pMVar7 = (MapIter *)&local_50.m_seqIt,
               local_70.m_type == Sequence ||
               (ppeVar6 = (element_type **)&local_70.m_mapIt, pMVar7 = &local_50.m_mapIt,
               local_70.m_type == Map)) &&
              ((pair<YAML::detail::node_*,_YAML::detail::node_*> *)*ppeVar6 != pMVar7->_M_current)))
             )) {
        Setup(this,*local_70.m_seqIt._M_current);
        detail::node_iterator_base<const_YAML::detail::node>::operator++(&local_70);
      }
    }
  }
  return;
}

Assistant:

void NodeEvents::Setup(const detail::node& node) {
  int& refCount = m_refCount[node.ref()];
  refCount++;
  if (refCount > 1)
    return;

  if (node.type() == NodeType::Sequence) {
    for (auto element : node)
      Setup(*element);
  } else if (node.type() == NodeType::Map) {
    for (auto element : node) {
      Setup(*element.first);
      Setup(*element.second);
    }
  }
}